

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preEnd__min____minmax_type
          (ColladaParserAutoGen15Private *this)

{
  byte bVar1;
  bool bVar2;
  ParserChar *in_RDI;
  float fVar3;
  bool returnValue;
  float parameter;
  ParserChar *ptrForErr;
  bool failed;
  ParserChar *in_stack_000000c8;
  ParserChar *in_stack_000000d0;
  StringHash in_stack_000000d8;
  ErrorType in_stack_000000e0;
  Severity in_stack_000000e4;
  ParserTemplateBase *in_stack_000000e8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined7 in_stack_fffffffffffffff0;
  byte in_stack_fffffffffffffff7;
  
  fVar3 = GeneratedSaxParser::Utils::toFloat
                    ((ParserChar **)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     in_RDI,(bool *)0xa0cf39);
  if ((in_stack_fffffffffffffff7 & 1) == 0) {
    bVar1 = (**(code **)(**(long **)(in_RDI + 0x108) + 0x36e8))(fVar3);
  }
  else {
    bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                      (in_stack_000000e8,in_stack_000000e4,in_stack_000000e0,in_stack_000000d8,
                       in_stack_000000d0,in_stack_000000c8);
    bVar1 = bVar2 ^ 0xff;
  }
  bVar1 = bVar1 & 1;
  if (*(long *)(in_RDI + 0x90) != 0) {
    GeneratedSaxParser::StackMemoryManager::deleteObject
              ((StackMemoryManager *)CONCAT17(in_stack_fffffffffffffff7,in_stack_fffffffffffffff0));
  }
  in_RDI[0x90] = '\0';
  in_RDI[0x91] = '\0';
  in_RDI[0x92] = '\0';
  in_RDI[0x93] = '\0';
  in_RDI[0x94] = '\0';
  in_RDI[0x95] = '\0';
  in_RDI[0x96] = '\0';
  in_RDI[0x97] = '\0';
  in_RDI[0x98] = '\0';
  in_RDI[0x99] = '\0';
  in_RDI[0x9a] = '\0';
  in_RDI[0x9b] = '\0';
  in_RDI[0x9c] = '\0';
  in_RDI[0x9d] = '\0';
  in_RDI[0x9e] = '\0';
  in_RDI[0x9f] = '\0';
  return (bool)(bVar1 & 1);
}

Assistant:

bool ColladaParserAutoGen15Private::_preEnd__min____minmax_type()
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateEnd__min____minmax_type();
        if ( !validationResult ) return false;

    } // validation
#endif

bool failed;
const ParserChar* ptrForErr = mLastIncompleteFragmentInCharacterData;
DISABLE_WARNING_UNUSED(ptrForErr)
float parameter = GeneratedSaxParser::Utils::toFloat((const ParserChar**)&mLastIncompleteFragmentInCharacterData, mEndOfDataInCurrentObjectOnStack, failed);
bool returnValue;
if (!failed)
{
    returnValue = mImpl->data__min____minmax_type(parameter);
}
else
    returnValue = !handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_TEXTDATA_PARSING_FAILED, HASH_ELEMENT_MIN, (const ParserChar*)0, mLastIncompleteFragmentInCharacterData);
if (mLastIncompleteFragmentInCharacterData)
    mStackMemoryManager.deleteObject();
mLastIncompleteFragmentInCharacterData = 0;
mEndOfDataInCurrentObjectOnStack = 0;
return returnValue;
}